

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O0

void __thiscall Assimp::MD5Importer::MD5Importer(MD5Importer *this)

{
  MD5Importer *this_local;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00f40e58;
  this->mIOHandler = (IOSystem *)0x0;
  std::__cxx11::string::string((string *)&this->mFile);
  this->mBuffer = (char *)0x0;
  this->fileSize = 0;
  this->iLineNumber = 0;
  this->pScene = (aiScene *)0x0;
  this->pIOHandler = (IOSystem *)0x0;
  this->bHadMD5Mesh = false;
  this->bHadMD5Anim = false;
  this->bHadMD5Camera = false;
  this->configNoAutoLoad = false;
  return;
}

Assistant:

MD5Importer::MD5Importer()
    : mIOHandler()
    , mBuffer()
    , fileSize()
    , iLineNumber()
    , pScene()
    , pIOHandler()
    , bHadMD5Mesh()
    , bHadMD5Anim()
    , bHadMD5Camera()
    , configNoAutoLoad (false)
{}